

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

double av1_get_kf_boost_projection_factor(int frame_count)

{
  int in_EDI;
  double factor;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = sqrt((double)in_EDI);
  if (10.0 <= local_18) {
    local_18 = 10.0;
  }
  if (local_18 <= 4.0) {
    local_20 = 4.0;
  }
  else {
    local_20 = local_18;
  }
  return local_20 * 14.0 + 75.0;
}

Assistant:

static inline double av1_get_kf_boost_projection_factor(int frame_count) {
  double factor = sqrt((double)frame_count);
  factor = AOMMIN(factor, 10.0);
  factor = AOMMAX(factor, 4.0);
  factor = (75.0 + 14.0 * factor);
  return factor;
}